

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfnt.cpp
# Opt level: O0

void __thiscall
dpfb::SfntOffsetTable::SfntOffsetTable(SfntOffsetTable *this,Stream *stream,uint32_t fontIdx)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  StreamError *pSVar4;
  value_type local_108;
  TableRecord tableRecord;
  string local_f8 [2];
  uint16_t i;
  uint16_t numTables;
  undefined1 local_d1;
  string local_d0 [32];
  uint32_t local_b0;
  undefined1 local_a9;
  uint32_t fontOffset;
  uint32_t local_88;
  undefined1 local_81;
  uint32_t numFonts;
  ushort local_5c;
  undefined1 local_59;
  string local_58 [4];
  uint16_t versionMinor;
  ushort local_32;
  uint32_t local_30;
  uint16_t versionMajor;
  uint32_t version;
  uint32_t local_1c;
  Stream *pSStack_18;
  uint32_t fontIdx_local;
  Stream *stream_local;
  SfntOffsetTable *this_local;
  
  (this->tableRecords).
  super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tableRecords).
  super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tableRecords).
  super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c = fontIdx;
  pSStack_18 = stream;
  stream_local = (Stream *)this;
  std::
  vector<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>::
  vector(&this->tableRecords);
  (*pSStack_18->_vptr_Stream[7])(pSStack_18,0);
  uVar2 = streams::Stream::readU32Be(pSStack_18);
  local_30 = uVar2;
  uVar3 = sfntTag('t','t','c','f');
  if (uVar2 == uVar3) {
    local_32 = streams::Stream::readU16Be(pSStack_18);
    if ((local_32 != 1) && (local_32 != 2)) {
      local_59 = 1;
      pSVar4 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_((char *)local_58,"Invalid TTC header major version %u",(ulong)local_32)
      ;
      streams::StreamError::runtime_error(pSVar4,local_58);
      local_59 = 0;
      __cxa_throw(pSVar4,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
    }
    local_5c = streams::Stream::readU16Be(pSStack_18);
    if (local_5c != 0) {
      local_81 = 1;
      pSVar4 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                ((char *)&numFonts,"Invalid TTC header minor version %u",(ulong)local_5c);
      streams::StreamError::runtime_error(pSVar4,(string *)&numFonts);
      local_81 = 0;
      __cxa_throw(pSVar4,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
    }
    local_88 = streams::Stream::readU32Be(pSStack_18);
    if (local_88 == 0) {
      pSVar4 = (StreamError *)__cxa_allocate_exception(0x10);
      streams::StreamError::runtime_error(pSVar4,"Collection has no fonts");
      __cxa_throw(pSVar4,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
    }
    if (local_88 <= local_1c) {
      local_a9 = 1;
      pSVar4 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                ((char *)&fontOffset,"Collection contains only %u fonts",(ulong)local_88);
      streams::StreamError::runtime_error(pSVar4,(string *)&fontOffset);
      local_a9 = 0;
      __cxa_throw(pSVar4,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
    }
    (*pSStack_18->_vptr_Stream[7])(pSStack_18,(ulong)local_1c << 2,1);
    local_b0 = streams::Stream::readU32Be(pSStack_18);
    (*pSStack_18->_vptr_Stream[7])(pSStack_18,(ulong)local_b0,0);
    local_30 = streams::Stream::readU32Be(pSStack_18);
  }
  else if (local_1c != 0) {
    local_d1 = 1;
    pSVar4 = (StreamError *)__cxa_allocate_exception(0x10);
    str::format_abi_cxx11_
              ((char *)local_d0,"Can\'t load font at index %u because font is not a collection",
               (ulong)local_1c);
    streams::StreamError::runtime_error(pSVar4,local_d0);
    local_d1 = 0;
    __cxa_throw(pSVar4,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
  }
  bVar1 = checkOffsetTableSignature(local_30);
  if (!bVar1) {
    tableRecord.offset._3_1_ = 1;
    pSVar4 = (StreamError *)__cxa_allocate_exception(0x10);
    str::format_abi_cxx11_((char *)local_f8,"Unsupported font format 0x%08x",(ulong)local_30);
    streams::StreamError::runtime_error(pSVar4,local_f8);
    tableRecord.offset._3_1_ = 0;
    __cxa_throw(pSVar4,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
  }
  tableRecord.offset._0_2_ = streams::Stream::readU16Be(pSStack_18);
  if ((uint16_t)tableRecord.offset != 0) {
    (*pSStack_18->_vptr_Stream[7])(pSStack_18,6,1);
    std::
    vector<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
    ::reserve(&this->tableRecords,(ulong)(uint16_t)tableRecord.offset);
    for (tableRecord.tag._2_2_ = 0; tableRecord.tag._2_2_ < (uint16_t)tableRecord.offset;
        tableRecord.tag._2_2_ = tableRecord.tag._2_2_ + 1) {
      local_108.tag = streams::Stream::readU32Be(pSStack_18);
      (*pSStack_18->_vptr_Stream[7])(pSStack_18,4,1);
      local_108.offset = streams::Stream::readU32Be(pSStack_18);
      std::
      vector<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
      ::push_back(&this->tableRecords,&local_108);
      (*pSStack_18->_vptr_Stream[7])(pSStack_18,4,1);
    }
    return;
  }
  pSVar4 = (StreamError *)__cxa_allocate_exception(0x10);
  streams::StreamError::runtime_error(pSVar4,"Font has no tables");
  __cxa_throw(pSVar4,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
}

Assistant:

SfntOffsetTable::SfntOffsetTable(
        Stream& stream, std::uint32_t fontIdx)
    : tableRecords {}
{
    stream.seek(0, SeekOrigin::set);

    auto version = stream.readU32Be();
    if (version == sfntTag('t', 't', 'c', 'f')) {
        const auto versionMajor = stream.readU16Be();
        if (versionMajor != 1 && versionMajor != 2)
            throw StreamError(str::format(
                "Invalid TTC header major version %" PRIu16,
                versionMajor));

        const auto versionMinor = stream.readU16Be();
        if (versionMinor != 0)
            throw StreamError(str::format(
                "Invalid TTC header minor version %" PRIu16,
                versionMinor));

        const auto numFonts = stream.readU32Be();
        if (numFonts == 0)
            throw StreamError("Collection has no fonts");

        if (fontIdx >= numFonts)
            throw StreamError(str::format(
                "Collection contains only %" PRIu32 " fonts",
                numFonts));

        stream.seek(fontIdx * sizeof(std::uint32_t), SeekOrigin::cur);
        const auto fontOffset = stream.readU32Be();
        stream.seek(fontOffset, SeekOrigin::set);

        version = stream.readU32Be();
    } else if (fontIdx > 0)
        throw StreamError(str::format(
            "Can't load font at index %" PRIu32 " because font is "
            "not a collection",
            fontIdx));

    if (!checkOffsetTableSignature(version))
        throw StreamError(str::format(
            "Unsupported font format 0x%08" PRIx32,
            version));

    const auto numTables = stream.readU16Be();
    if (numTables == 0)
        throw StreamError("Font has no tables");

    // Skip search range, entry selector, and range shift
    stream.seek(3 * sizeof(std::uint16_t), SeekOrigin::cur);

    tableRecords.reserve(numTables);
    for (std::uint16_t i = 0; i < numTables; ++i) {
        TableRecord tableRecord;
        tableRecord.tag = stream.readU32Be();

        // Skip checksum
        stream.seek(sizeof(std::uint32_t), SeekOrigin::cur);

        tableRecord.offset = stream.readU32Be();
        tableRecords.push_back(tableRecord);

        // Skip length
        stream.seek(sizeof(std::uint32_t), SeekOrigin::cur);
    }
}